

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O3

err_t dstuSign(octet *sig,dstu_params *params,size_t ld,octet *hash,size_t hash_len,octet *privkey,
              gen_i rng,void *rng_state)

{
  word *a;
  word *b;
  u64 *dest;
  u64 *dest_00;
  u64 *stack;
  byte *pbVar1;
  ec_o *ec_00;
  word *pwVar2;
  err_t eVar3;
  bool_t bVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong count;
  u64 *dest_01;
  ec_o *ec;
  ec_o *local_60;
  size_t local_58;
  ulong local_50;
  octet *local_48;
  ulong local_40;
  word *local_38;
  
  local_60 = (ec_o *)0x0;
  if (rng == (gen_i)0x0) {
    eVar3 = 0x130;
  }
  else {
    eVar3 = dstuEcCreate(&local_60,params,dstuSign_deep);
    ec_00 = local_60;
    if (eVar3 == 0) {
      sVar5 = wwBitSize(local_60->order,local_60->f->n);
      count = sVar5 + 7 >> 3;
      local_48 = privkey;
      bVar4 = memIsValid(privkey,count);
      eVar3 = 0x6d;
      if (count << 4 <= ld && ((ld & 0xf) == 0 && bVar4 != 0)) {
        bVar4 = memIsValid(hash,hash_len);
        if (bVar4 != 0) {
          local_50 = ld >> 3;
          bVar4 = memIsValid(sig,local_50);
          if (bVar4 != 0) {
            dest_01 = (u64 *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
            sVar6 = ec_00->f->n;
            uVar7 = ec_00->f->no;
            a = dest_01 + sVar6;
            b = a + sVar6;
            local_38 = b + sVar6;
            dest = local_38 + sVar6;
            dest_00 = dest + sVar6;
            stack = dest_00 + sVar6;
            local_58 = ld;
            if (hash_len < uVar7) {
              memCopy(a,hash,hash_len);
              memSet((void *)((long)a + hash_len),'\0',ec_00->f->no - hash_len);
            }
            else {
              memCopy(a,hash,uVar7);
              sVar6 = gf2Deg(ec_00->f);
              pbVar1 = (byte *)((long)a + (ec_00->f->no - 1));
              *pbVar1 = *pbVar1 & ~(-1 << ((byte)sVar6 & 7));
            }
            (*ec_00->f->from)(a,(octet *)a,ec_00->f,stack);
            bVar4 = wwIsZero(a,ec_00->f->n);
            if (bVar4 != 0) {
              wwCopy(a,ec_00->f->unity,ec_00->f->n);
            }
            uVar7 = sVar5 + 0x3f >> 6;
            local_40 = count;
            do {
              do {
                do {
                  do {
                    (*rng)(dest_01,count,rng_state);
                    u64From(dest_01,dest_01,count);
                    wwTrimHi(dest_01,uVar7,sVar5 - 1);
                    bVar4 = wwIsZero(dest_01,uVar7);
                  } while (bVar4 != 0);
                  bVar4 = ecMulA(b,ec_00->base,ec_00,dest_01,uVar7,stack);
                  if (bVar4 == 0) {
                    eVar3 = 0x1f6;
                    goto LAB_00138d57;
                  }
                  bVar4 = wwIsZero(b,ec_00->f->n);
                  pwVar2 = local_38;
                } while (bVar4 != 0);
                (*ec_00->f->mul)(local_38,b,a,ec_00->f,stack);
                count = local_40;
                (*ec_00->f->to)((octet *)dest,pwVar2,ec_00->f,stack);
                u64From(dest,dest,count);
                wwTrimHi(dest,uVar7,sVar5 - 1);
                bVar4 = wwIsZero(dest,uVar7);
              } while (bVar4 != 0);
              u64From(dest_00,local_48,count);
              zzMulMod(dest_00,dest_00,dest,ec_00->order,uVar7,stack);
              zzAddMod(dest_00,dest_00,dest_01,ec_00->order,uVar7);
              bVar4 = wwIsZero(dest_00,uVar7);
            } while (bVar4 != 0);
            eVar3 = 0;
            memSet(sig,'\0',local_50);
            u64To(sig,count,dest);
            u64To(sig + (local_58 >> 4),count,dest_00);
          }
        }
      }
LAB_00138d57:
      blobClose(ec_00);
    }
  }
  return eVar3;
}

Assistant:

err_t dstuSign(octet sig[], const dstu_params* params, size_t ld, 
	const octet hash[], size_t hash_len, const octet privkey[], 
	gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* e;		/* эфемерный лк */
	word* h;		/* хэш-значение как элемент поля */
	word* x;		/* х-координата эфемерного ок */
	word* y;		/* y-координата эфемерного ок */
	word* r;		/* первая часть ЭЦП */
	word* s;		/* вторая часть ЭЦП */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	// шаги 1, 2: проверка params, privkey
	// шаг 3: проверить ld
	if (!memIsValid(privkey, order_no) || 
		ld % 16 != 0 || ld < 16 * order_no ||
		!memIsValid(hash, hash_len) ||
		!memIsValid(sig, O_OF_B(ld)))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	e = objEnd(ec, word);
	h = e + ec->f->n;
	x = h + ec->f->n;
	y = x + ec->f->n;
	r = y + ec->f->n;
	s = r + ec->f->n;
	stack = s + ec->f->n;
	// шаги 4 -- 6: хэширование
	// шаг 7: перевести hash в элемент основного поля h
	// [алгоритм из раздела 5.9 ДСТУ]
	if (hash_len < ec->f->no)
	{
		memCopy(h, hash, hash_len);
		memSetZero((octet*)h + hash_len, ec->f->no - hash_len);
	}
	else
	{
		memCopy(h, hash, ec->f->no);
		// memTrimHi(h, ec->f->no, gf2Deg(ec->f));
		((octet*)h)[ec->f->no - 1] &= (1 << gf2Deg(ec->f) % 8) - 1;
	}
	qrFrom(h, (octet*)h, ec->f, stack);
	// шаг 7: если h == 0, то h <- 1
	if (qrIsZero(h, ec->f))
		qrSetUnity(h, ec->f);
	// шаг 8: e <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка e]
step8:
	while (1)
	{
		rng(e, O_OF_B(order_nb), rng_state);
		wwFrom(e, e, O_OF_B(order_nb));
		wwTrimHi(e, order_n, order_nb - 1);
		ASSERT(wwCmp(e, ec->order, order_n) < 0);
		if (!wwIsZero(e, order_n))
			break;
	}
	// шаг 8: (x, y) <- e G
	if (!ecMulA(x, ec->base, ec, e, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// шаг 8: если x == 0, то повторить генерацию
	if (qrIsZero(x, ec->f))
		goto step8;
	// шаг 9: y <- x * h
	qrMul(y, x, h, ec->f, stack);
	// шаг 10: r <- \bar{y}
	ASSERT(order_n <= ec->f->n);
	qrTo((octet*)r, y, ec->f, stack);
	wwFrom(r, r, order_no);
	wwTrimHi(r, order_n, order_nb - 1);
	// шаг 11: если r = 0, то повторить генерацию
	if (wwIsZero(r, order_n))
		goto step8;
	// шаг 12: s <- (e + dr) mod order
	wwFrom(s, privkey, order_no);
	zzMulMod(s, s, r, ec->order, order_n, stack);
	zzAddMod(s, s, e, ec->order, order_n);
	// шаг 13: если s = 0, то повторить генерацию
	if (wwIsZero(s, order_n))
		goto step8;
	// шаг 14: сформировать ЭЦП из r и s
	// [алгоритм из раздела 5.10 ДСТУ]
	memSetZero(sig, O_OF_B(ld));
	wwTo(sig, order_no, r);
	wwTo(sig + ld / 16, order_no, s);
	// все нормально
	dstuEcClose(ec);
	return code;
}